

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall
chatra::RuntimeImp::restoreNode(RuntimeImp *this,Reader *r,PackageId packageId,Node *node)

{
  bool bVar1;
  NodeState NVar2;
  Package *errorReceiver;
  AbortCompilingException *this_00;
  AbortCompilingException *anon_var_0;
  undefined1 local_50 [8];
  shared_ptr<chatra::Node> n;
  IErrorReceiverBridge errorReceiverBridge;
  Node *node_local;
  PackageId packageId_local;
  Reader *r_local;
  RuntimeImp *this_local;
  
  NVar2 = std::atomic::operator_cast_to_NodeState((atomic *)&node->blockNodesState);
  if (NVar2 != Parsed) {
    IErrorReceiverBridge::IErrorReceiverBridge
              ((IErrorReceiverBridge *)
               &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &this->super_IErrorReceiver);
    errorReceiver = IdPool<chatra::PackageId,_chatra::Package>::ref(&this->packageIds,packageId);
    Package::parseNode((Package *)local_50,(IErrorReceiver *)errorReceiver,
                       (Node *)&n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,SUB81(node,0));
    std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)local_50);
    bVar1 = IErrorReceiverBridge::hasError
                      ((IErrorReceiverBridge *)
                       &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (bVar1) {
      this_00 = (AbortCompilingException *)__cxa_allocate_exception(8);
      *this_00 = (AbortCompilingException)0x0;
      AbortCompilingException::AbortCompilingException(this_00);
      __cxa_throw(this_00,&AbortCompilingException::typeinfo,
                  AbortCompilingException::~AbortCompilingException);
    }
    std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)local_50);
    restoreEntities(this,r,packageId,node);
    IErrorReceiverBridge::~IErrorReceiverBridge
              ((IErrorReceiverBridge *)
               &n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void RuntimeImp::restoreNode(Reader& r, PackageId packageId, Node* node) {
	if (node->blockNodesState == NodeState::Parsed)
		return;

	IErrorReceiverBridge errorReceiverBridge(*this);
	try {
		auto n = packageIds.ref(packageId)->parseNode(errorReceiverBridge, node);
		n.reset();
		if (errorReceiverBridge.hasError())
			throw AbortCompilingException();
	}
	catch (AbortCompilingException&) {
		errorAtNode(*this, ErrorLevel::Error, node, "an unrecoverable parser error encountered during restoration", {});
		throw IllegalArgumentException();
	}

	restoreEntities(r, packageId, node);
}